

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyph.cc
# Opt level: O0

bool woff2::ReadCompositeGlyphData(Buffer *buffer,Glyph *glyph)

{
  bool bVar1;
  uint uVar2;
  uint8_t *puVar3;
  size_t sVar4;
  ulong uVar5;
  size_t local_38;
  size_t arg_size;
  size_t sStack_28;
  uint16_t flags;
  size_t start_offset;
  Glyph *glyph_local;
  Buffer *buffer_local;
  
  glyph->have_instructions = false;
  start_offset = (size_t)glyph;
  glyph_local = (Glyph *)buffer;
  puVar3 = Buffer::buffer(buffer);
  sVar4 = Buffer::offset((Buffer *)glyph_local);
  *(uint8_t **)(start_offset + 0x30) = puVar3 + sVar4;
  sStack_28 = Buffer::offset((Buffer *)glyph_local);
  arg_size._6_2_ = 0x20;
  while( true ) {
    if ((arg_size._6_2_ & 0x20) == 0) {
      sVar4 = Buffer::offset((Buffer *)glyph_local);
      uVar5 = sVar4 - sStack_28;
      uVar2 = std::numeric_limits<unsigned_int>::max();
      if (uVar2 < uVar5) {
        return false;
      }
      sVar4 = Buffer::offset((Buffer *)glyph_local);
      *(int *)(start_offset + 0x38) = (int)sVar4 - (int)sStack_28;
      return true;
    }
    bVar1 = Buffer::ReadU16((Buffer *)glyph_local,(uint16_t *)((long)&arg_size + 6));
    if (!bVar1) break;
    *(bool *)(start_offset + 0x3c) =
         (*(byte *)(start_offset + 0x3c) & 1) != 0 || (arg_size._6_2_ & 0x100) != 0;
    if ((arg_size._6_2_ & 1) == 0) {
      local_38 = 4;
    }
    else {
      local_38 = 6;
    }
    if ((arg_size._6_2_ & 8) == 0) {
      if ((arg_size._6_2_ & 0x40) == 0) {
        if ((arg_size._6_2_ & 0x80) != 0) {
          local_38 = local_38 + 8;
        }
      }
      else {
        local_38 = local_38 + 4;
      }
    }
    else {
      local_38 = local_38 + 2;
    }
    bVar1 = Buffer::Skip((Buffer *)glyph_local,local_38);
    if (!bVar1) {
      return false;
    }
  }
  return false;
}

Assistant:

bool ReadCompositeGlyphData(Buffer* buffer, Glyph* glyph) {
  glyph->have_instructions = false;
  glyph->composite_data = buffer->buffer() + buffer->offset();
  size_t start_offset = buffer->offset();
  uint16_t flags = kFLAG_MORE_COMPONENTS;
  while (flags & kFLAG_MORE_COMPONENTS) {
    if (!buffer->ReadU16(&flags)) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyph->have_instructions |= (flags & kFLAG_WE_HAVE_INSTRUCTIONS) != 0;
    size_t arg_size = 2;  // glyph index
    if (flags & kFLAG_ARG_1_AND_2_ARE_WORDS) {
      arg_size += 4;
    } else {
      arg_size += 2;
    }
    if (flags & kFLAG_WE_HAVE_A_SCALE) {
      arg_size += 2;
    } else if (flags & kFLAG_WE_HAVE_AN_X_AND_Y_SCALE) {
      arg_size += 4;
    } else if (flags & kFLAG_WE_HAVE_A_TWO_BY_TWO) {
      arg_size += 8;
    }
    if (!buffer->Skip(arg_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
  }
  if (buffer->offset() - start_offset > std::numeric_limits<uint32_t>::max()) {
    return FONT_COMPRESSION_FAILURE();
  }
  glyph->composite_data_size = buffer->offset() - start_offset;
  return true;
}